

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

Function * __thiscall LinkedObjectFile::get_function_at_label(LinkedObjectFile *this,int label_id)

{
  int iVar1;
  pointer pLVar2;
  pointer pvVar3;
  Function *pFVar4;
  Function *pFVar5;
  Function *pFVar6;
  Function *pFVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar9 = (ulong)label_id;
  pLVar2 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) * -0x3333333333333333;
  if (uVar9 <= uVar8 && uVar8 - uVar9 != 0) {
    uVar10 = (ulong)pLVar2[uVar9].target_segment;
    pvVar3 = (this->functions_by_seg).
             super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->functions_by_seg).
                   super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
            -0x5555555555555555;
    if (uVar10 <= uVar8 && uVar8 - uVar10 != 0) {
      pFVar4 = pvVar3[uVar10].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar5 = *(pointer *)
                ((long)&pvVar3[uVar10].super__Vector_base<Function,_std::allocator<Function>_>.
                        _M_impl.super__Vector_impl_data + 8);
      bVar11 = pFVar4 == pFVar5;
      pFVar7 = pFVar4;
      if (!bVar11) {
        iVar1 = pFVar4->start_word;
        pFVar6 = pFVar4;
        while (pFVar7 = pFVar6, iVar1 * 4 + 4 != pLVar2[uVar9].offset) {
          bVar11 = pFVar6 + 1 == pFVar5;
          pFVar7 = pFVar4;
          if (bVar11) break;
          iVar1 = pFVar6[1].start_word;
          pFVar6 = pFVar6 + 1;
        }
      }
      if (bVar11) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0x5c,"Function &LinkedObjectFile::get_function_at_label(int)");
      }
      return pFVar7;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

Function& LinkedObjectFile::get_function_at_label(int label_id) {
  auto& label = labels.at(label_id);
  for (auto& func : functions_by_seg.at(label.target_segment)) {
    // + 4 to skip past type tag to the first word, which is were the label points.
    if (func.start_word * 4 + 4 == label.offset) {
      return func;
    }
  }

  assert(false);
  return functions_by_seg.front().front(); // to avoid error
}